

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::PathTypeHandlerBase::ProcessFixedFieldChange
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex slotIndex,Var value,bool isNonFixed,PropertyRecord *propertyRecord)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint16 uVar4;
  BOOL BVar5;
  DynamicTypeHandler *this_00;
  undefined4 *puVar6;
  PathTypeHandlerBase *this_01;
  TypePath *pTVar7;
  ScriptContext *scriptContext;
  RecyclerWeakReference<Js::DynamicObject> *pRVar8;
  TypePath *pTVar9;
  DynamicObject *pDVar10;
  bool local_6c;
  bool local_6b;
  bool local_6a;
  bool local_69;
  RecyclerWeakReference<Js::DynamicObject> *singletonWeakRef;
  RecyclerWeakReference<Js::DynamicObject> *singletonWeakRef_1;
  bool markAsFixed;
  PathTypeHandlerBase *newTypeHandler;
  bool populateInlineCache;
  bool isNonFixed_local;
  Var value_local;
  PropertyIndex slotIndex_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  this_00 = DynamicObject::GetTypeHandler(instance);
  bVar2 = DynamicTypeHandler::GetIsShared(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xc52,"(!instance->GetTypeHandler()->GetIsShared())",
                                "!instance->GetTypeHandler()->GetIsShared()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar5 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
  if ((BVar5 != 0) && (!isNonFixed)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xc55,"(!instance->IsExternal() || isNonFixed)",
                                "!instance->IsExternal() || isNonFixed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = FixPropsOnPathTypes();
  if (bVar2) {
    this_local._7_1_ = true;
    this_01 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(instance);
    pTVar7 = GetTypePath(this_01);
    bVar3 = TypePath::GetMaxInitializedLength(pTVar7);
    if (slotIndex < bVar3) {
      scriptContext = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      InvalidateFixedFieldAt(this_01,propertyId,slotIndex,scriptContext);
      pTVar7 = GetTypePath(this_01);
      bVar3 = TypePath::GetMaxInitializedLength(pTVar7);
      if (slotIndex + 1 == (uint)bVar3) {
        pTVar7 = GetTypePath(this_01);
        pRVar8 = TypePath::GetSingletonInstance(pTVar7);
        if ((pRVar8 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           (pDVar10 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar8),
           instance != pDVar10)) {
          bVar2 = HasSingletonInstanceOnlyIfNeeded(this_01);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0xc8e,
                                        "(newTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                        "newTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          pTVar7 = GetTypePath(this_01);
          TypePath::ClearSingletonInstance(pTVar7);
        }
      }
    }
    else {
      pTVar7 = GetTypePath(this_01);
      bVar3 = TypePath::GetMaxInitializedLength(pTVar7);
      if (slotIndex != bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc65,
                                    "(slotIndex == newTypeHandler->GetTypePath()->GetMaxInitializedLength())"
                                    ,"Adding properties out of order?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = DynamicTypeHandler::ShouldFixAnyProperties();
      if ((bVar2) && (bVar2 = DynamicTypeHandler::CanBeSingletonInstance(instance), bVar2)) {
        local_69 = false;
        if (!isNonFixed) {
          BVar5 = IsInternalPropertyId(propertyId);
          local_69 = false;
          if (BVar5 == 0) {
            bVar2 = VarIs<Js::JavascriptFunction>(value);
            if (bVar2) {
              bVar2 = DynamicTypeHandler::ShouldFixMethodProperties();
              local_6a = true;
              if (!bVar2) {
                local_6a = DynamicTypeHandler::ShouldFixAccessorProperties();
              }
              local_6b = local_6a;
            }
            else {
              bVar2 = DynamicTypeHandler::ShouldFixDataProperties();
              local_6c = false;
              if (bVar2) {
                local_6c = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                                     (instance,propertyRecord,propertyId,value);
              }
              local_6b = local_6c;
            }
            local_69 = local_6b;
          }
        }
        pTVar7 = GetTypePath(this_01);
        uVar4 = GetPathLength(this_01);
        TypePath::AddSingletonInstanceFieldAt(pTVar7,instance,slotIndex,local_69,(uint)uVar4);
      }
      else {
        pTVar7 = GetTypePath(this_01);
        uVar4 = GetPathLength(this_01);
        TypePath::AddSingletonInstanceFieldAt(pTVar7,slotIndex,(uint)uVar4);
      }
      this_local._7_1_ = false;
    }
    pTVar7 = GetTypePath(this);
    pRVar8 = TypePath::GetSingletonInstance(pTVar7);
    pTVar7 = GetTypePath(this_01);
    pTVar9 = GetTypePath(this);
    if (((pTVar7 != pTVar9) && (pRVar8 != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) &&
       (pDVar10 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar8), pDVar10 == instance
       )) {
      uVar4 = GetPathLength(this);
      pTVar7 = GetTypePath(this);
      bVar3 = TypePath::GetMaxInitializedLength(pTVar7);
      if (uVar4 < bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc9a,
                                    "(GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength())"
                                    ,
                                    "GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = HasSingletonInstanceOnlyIfNeeded(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc9b,"(HasSingletonInstanceOnlyIfNeeded())",
                                    "HasSingletonInstanceOnlyIfNeeded()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pTVar7 = GetTypePath(this);
      TypePath::ClearSingletonInstance(pTVar7);
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PathTypeHandlerBase::ProcessFixedFieldChange(DynamicObject* instance, PropertyId propertyId, PropertyIndex slotIndex, Var value, bool isNonFixed,const PropertyRecord * propertyRecord)
    {
        Assert(!instance->GetTypeHandler()->GetIsShared());
        // We don't want fixed properties on external objects, either external properties or expando properties.
        // See DynamicObject::ResetObject for more information.
        Assert(!instance->IsExternal() || isNonFixed);

        if (!FixPropsOnPathTypes())
        {
            return true;
        }

        bool populateInlineCache = true;

        PathTypeHandlerBase* newTypeHandler = (PathTypeHandlerBase*)instance->GetTypeHandler();

        if (slotIndex >= newTypeHandler->GetTypePath()->GetMaxInitializedLength())
        {
            // We are adding a property where no instance property has been set before.  We rely on properties being
            // added in order of indexes to be sure that we don't leave any uninitialized properties interspersed with
            // initialized ones, which could lead to incorrect behavior.  See comment in TypePath::Branch.
            AssertMsg(slotIndex == newTypeHandler->GetTypePath()->GetMaxInitializedLength(), "Adding properties out of order?");

            // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to
            // undefined or even some other special illegal value (for let or const, currently == null)
            // Assert(instance->GetSlot(index) == nullptr);

            if (ShouldFixAnyProperties() && CanBeSingletonInstance(instance))
            {
                bool markAsFixed = !isNonFixed && !IsInternalPropertyId(propertyId) &&
                    (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() || ShouldFixAccessorProperties() :
                                    (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyRecord, propertyId, value)));

                // Mark the newly added field as fixed and prevent population of inline caches.

                newTypeHandler->GetTypePath()->AddSingletonInstanceFieldAt(instance, slotIndex, markAsFixed, newTypeHandler->GetPathLength());
            }
            else
            {
                newTypeHandler->GetTypePath()->AddSingletonInstanceFieldAt(slotIndex, newTypeHandler->GetPathLength());
            }

            populateInlineCache = false;
        }
        else
        {
            newTypeHandler->InvalidateFixedFieldAt(propertyId, slotIndex, instance->GetScriptContext());

            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.
            if (slotIndex + 1 == newTypeHandler->GetTypePath()->GetMaxInitializedLength())
            {
                // If we cleared the singleton instance while some fields remained fixed, the instance would
                // be collectible, and yet some code would expect to see values and call methods on it. We rely on the
                // fact that we always add properties to (pre-initialized) type handlers in the order they appear
                // on the type path.  By the time we reach the singleton instance, all fixed fields will have been invalidated.
                // Otherwise, some fields could remain fixed (or even uninitialized) and we would have to spin off a loop here
                // to invalidate any remaining fixed fields
                auto singletonWeakRef = newTypeHandler->GetTypePath()->GetSingletonInstance();
                if (singletonWeakRef != nullptr && instance != singletonWeakRef->Get())
                {
                    Assert(newTypeHandler->HasSingletonInstanceOnlyIfNeeded());
                    newTypeHandler->GetTypePath()->ClearSingletonInstance();
                }
            }
        }

        // If we branched and this is the singleton instance, we need to remove it from this type handler.  The only time
        // this can happen is when another not fully initialized instance is ahead of this one on the current path.
        auto singletonWeakRef = this->GetTypePath()->GetSingletonInstance();
        if (newTypeHandler->GetTypePath() != this->GetTypePath() && singletonWeakRef != nullptr && singletonWeakRef->Get() == instance)
        {
            // If this is the singleton instance, there shouldn't be any other initialized instance ahead of it on the old path.
            Assert(GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength());
            Assert(HasSingletonInstanceOnlyIfNeeded());
            this->GetTypePath()->ClearSingletonInstance();
        }

        return populateInlineCache;
    }